

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DensityPlot.cpp
# Opt level: O1

void __thiscall OpenMD::DensityPlot::writeDensity(DensityPlot *this)

{
  char cVar1;
  ostream *poVar2;
  ulong uVar3;
  ofstream ofs;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream
            (&local_228,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"DensityPlot: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"#g(x, y, z)\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"#selection: (",0xd);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_228,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"#cmSelection:(",0xe);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_228,(this->cmSelectionScript_)._M_dataplus._M_p,
                        (this->cmSelectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"#nRBins = ",10);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_228,this->nRBins_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t maxLen = ",0xb);
    poVar2 = std::ostream::_M_insert<double>(this->len_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tdeltaR = ",10);
    poVar2 = std::ostream::_M_insert<double>(this->deltaR_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        poVar2 = std::ostream::_M_insert<double>((double)uVar3 * this->deltaR_ - this->halfLen_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->density_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar3]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (uVar3 < (ulong)((long)(this->histogram_).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->histogram_).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 2));
    }
  }
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void DensityPlot::writeDensity() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);
    if (ofs.is_open()) {
      ofs << "#g(x, y, z)\n";
      ofs << "#selection: (" << selectionScript_ << ")\n";
      ofs << "#cmSelection:(" << cmSelectionScript_ << ")\n";
      ofs << "#nRBins = " << nRBins_ << "\t maxLen = " << len_
          << "\tdeltaR = " << deltaR_ << "\n";
      for (unsigned int i = 0; i < histogram_.size(); ++i) {
        ofs << i * deltaR_ - halfLen_ << "\t" << density_[i] << std::endl;
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DensityPlot: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }